

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O3

void __thiscall Js::JavascriptSet::AddToEmptySet(JavascriptSet *this,Var value)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  Var pvVar5;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Recycler *pRVar6;
  BVSparse<Memory::Recycler> *this_01;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  char *message;
  char *error;
  uint lineNumber;
  undefined **local_78;
  SetDataNode *node;
  size_t local_68;
  char *local_60;
  DWORD local_58;
  Var local_50;
  Var value_local;
  Var taggedInt;
  Var simpleVar;
  
  local_50 = value;
  if (this->kind != EmptySet) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x13e,"(this->kind == SetKind::EmptySet)",
                                "this->kind == SetKind::EmptySet");
    if (!bVar2) goto LAB_00d0c789;
    *puVar4 = 0;
  }
  pvVar5 = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,false>(value);
  value_local = pvVar5;
  if (pvVar5 == (Var)0x0) {
    pvVar5 = JavascriptConversion::TryCanonicalizeAsSimpleVar<false>(value);
    taggedInt = pvVar5;
    pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    simpleVar = &this->list;
    addr = &this->u;
    if (pvVar5 == (Var)0x0) {
      local_78 = &JsUtil::
                  BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      node = (SetDataNode *)0x0;
      local_68 = 0xffffffffffffffff;
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
      ;
      local_58 = 0x15c;
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)&stack0xffffffffffffff88);
      this_02 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar6,0x387914);
      pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,pRVar6,0);
      pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      local_78 = (undefined **)
                 MapOrSetDataList<void_*>::Append
                           ((MapOrSetDataList<void_*> *)simpleVar,&local_50,pRVar6);
      JsUtil::
      BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_02,&local_50,(MapOrSetDataNode<void_*> **)&stack0xffffffffffffff88);
      Memory::Recycler::WBSetBit((char *)&addr->simpleVarSet);
      *(BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        **)&(this->u).simpleVarSet = this_02;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      TVar3 = ComplexVarSet;
    }
    else {
      local_78 = &JsUtil::
                  BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      node = (SetDataNode *)0x0;
      local_68 = 0xffffffffffffffff;
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
      ;
      local_58 = 0x152;
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)&stack0xffffffffffffff88);
      this_00 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar6,0x387914);
      pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      JsUtil::
      BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_00,pRVar6,0);
      pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
      local_78 = (undefined **)
                 MapOrSetDataList<void_*>::Append
                           ((MapOrSetDataList<void_*> *)simpleVar,&taggedInt,pRVar6);
      JsUtil::
      BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&taggedInt,(MapOrSetDataNode<void_*> **)&stack0xffffffffffffff88);
      Memory::Recycler::WBSetBit((char *)&addr->simpleVarSet);
      *(BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        **)&(this->u).simpleVarSet = this_00;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      TVar3 = SimpleVarSet;
    }
    this->kind = TVar3;
    return;
  }
  if (((ulong)pvVar5 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d0c5f6;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "(Is(aValue))";
    message = "Ensure var is actually a \'TaggedInt\'";
    lineNumber = 0x43;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,lineNumber,error,message);
  if (!bVar2) {
LAB_00d0c789:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00d0c5f6:
  pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  local_78 = &BVSparse<Memory::Recycler>::typeinfo;
  node = (SetDataNode *)0x0;
  local_68 = 0xffffffffffffffff;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
  ;
  local_58 = 0x145;
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)&stack0xffffffffffffff88);
  this_01 = (BVSparse<Memory::Recycler> *)new<Memory::Recycler>(0x20,pRVar6,0x387914);
  pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  (this_01->head).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  (this_01->lastFoundIndex).ptr = (BVSparseNode<Memory::Recycler> *)0x0;
  this_01->alloc = pRVar6;
  (this_01->lastUsedNodePrevNextField).ptr = (WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)0x0
  ;
  Memory::Recycler::WBSetBit((char *)&this_01->lastUsedNodePrevNextField);
  (this_01->lastUsedNodePrevNextField).ptr =
       (WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> *)this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_01->lastUsedNodePrevNextField);
  BVSparse<Memory::Recycler>::Set(this_01,(BVIndex)pvVar5);
  pRVar6 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  MapOrSetDataList<void_*>::Append(&this->list,&value_local,pRVar6);
  Memory::Recycler::WBSetBit((char *)&(this->u).simpleVarSet);
  *(BVSparse<Memory::Recycler> **)&(this->u).simpleVarSet = this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->u);
  this->kind = IntSet;
  return;
}

Assistant:

void
JavascriptSet::AddToEmptySet(Var value)
{
    Assert(this->kind == SetKind::EmptySet);
    // We cannot store an int with value -1 inside of a bit vector
    Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, false /* allowLossyConversion */>(value);
    if (taggedInt)
    {
        int32 intVal = TaggedInt::ToInt32(taggedInt);

        BVSparse<Recycler>* newIntSet = RecyclerNew(this->GetRecycler(), BVSparse<Recycler>, this->GetRecycler());
        newIntSet->Set(intVal);

        this->list.Append(taggedInt, this->GetRecycler());

        this->u.intSet = newIntSet;
        this->kind = SetKind::IntSet;
        return;
    }

    Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<false /* allowLossyConversion */>(value);
    if (simpleVar)
    {
        SimpleVarDataSet* newSimpleSet = RecyclerNew(this->GetRecycler(), SimpleVarDataSet, this->GetRecycler());
        SetDataNode* node = this->list.Append(simpleVar, this->GetRecycler());

        newSimpleSet->Add(simpleVar, node);

        this->u.simpleVarSet = newSimpleSet;
        this->kind = SetKind::SimpleVarSet;
        return;
    }

    ComplexVarDataSet* newComplexSet = RecyclerNew(this->GetRecycler(), ComplexVarDataSet, this->GetRecycler());
    SetDataNode* node = this->list.Append(value, this->GetRecycler());

    newComplexSet->Add(value, node);

    this->u.complexVarSet = newComplexSet;
    this->kind = SetKind::ComplexVarSet;
}